

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

void cg_statement(dill_stream s,sm_ref stmt,cod_code descr)

{
  cod_code descr_00;
  sm_ref in_RDX;
  cod_code in_RSI;
  sm_ref in_RDI;
  cod_code unaff_retaddr;
  sm_ref in_stack_00000008;
  dill_stream in_stack_00000010;
  cod_code in_stack_00000e98;
  int in_stack_00000ea4;
  sm_ref in_stack_00000ea8;
  dill_stream in_stack_00000eb0;
  sm_ref in_stack_ffffffffffffffb8;
  sm_ref in_stack_ffffffffffffffc8;
  dill_stream in_stack_ffffffffffffffd0;
  cod_code in_stack_ffffffffffffffe0;
  
  if (in_RSI != (cod_code)0x0) {
    descr_00 = (cod_code)(ulong)*(uint *)&in_RSI->func;
    switch(descr_00) {
    case (cod_code)0x0:
      cg_compound_statement((dill_stream)descr_00,in_stack_ffffffffffffffb8,(cod_code)0x13e612);
      break;
    default:
      printf("unhandled case in cg_statement\n");
      break;
    case (cod_code)0x3:
      dill_mark_label(in_RDI,*(undefined4 *)&in_RSI->code_memory_block);
      cg_statement((dill_stream)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
      break;
    case (cod_code)0x4:
      cg_return_statement((dill_stream)unaff_retaddr,in_RDI,in_RSI);
      break;
    case (cod_code)0x5:
      cg_jump_statement(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,descr_00);
      break;
    case (cod_code)0x6:
      cg_selection_statement(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,descr_00);
      break;
    case (cod_code)0x7:
      cg_iteration_statement(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      break;
    case (cod_code)0x8:
      cg_expr(in_stack_00000eb0,in_stack_00000ea8,in_stack_00000ea4,in_stack_00000e98);
    }
  }
  return;
}

Assistant:

static void
cg_statement(dill_stream s, sm_ref stmt, cod_code descr)
{
    if (!stmt) return;
    switch(stmt->node_type) {
    case cod_selection_statement:
	cg_selection_statement(s, stmt, descr);
	break;
    case cod_iteration_statement:
	cg_iteration_statement(s, stmt, descr);
	break;
    case cod_expression_statement: 
	(void) cg_expr(s, stmt->node.expression_statement.expression, 0, descr);
	break;
    case cod_compound_statement:
	cg_compound_statement(s, stmt, descr);
	break;
    case cod_return_statement:
	cg_return_statement(s, stmt, descr);
	break;
    case cod_jump_statement:
	cg_jump_statement(s, stmt, descr);
	break;
    case cod_label_statement: {
	dill_mark_label(s, stmt->node.label_statement.cg_label);
	cg_statement(s, stmt->node.label_statement.statement, descr);
	break;
    }
    default:
	printf("unhandled case in cg_statement\n");
    }
}